

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GenerateGetBitFromLocal_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"from_",&local_39);
  anon_unknown_0::GenerateGetBitInternal(__return_storage_ptr__,&local_38,(int)this);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetBitFromLocal(int bitIndex) {
  return GenerateGetBitInternal("from_", bitIndex);
}